

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softplus.cpp
# Opt level: O2

int __thiscall ncnn::Softplus::forward_inplace(Softplus *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  float fVar9;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar8 = bottom_top_blob->data;
  sVar1 = bottom_top_blob->cstep;
  sVar2 = bottom_top_blob->elemsize;
  uVar6 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar6;
  }
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar6;
  }
  for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      fVar9 = expf(*(float *)((long)pvVar8 + uVar5 * 4));
      fVar9 = logf(fVar9 + 1.0);
      *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
    }
    pvVar8 = (void *)((long)pvVar8 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int Softplus::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        for (int i = 0; i < size; i++)
        {
            ptr[i] = log(exp(ptr[i]) + 1.0f);
        }
    }

    return 0;
}